

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

SQInteger __thiscall SQCompiler::Factor(SQCompiler *this)

{
  SQUnsignedInteger *pSVar1;
  SQUnsignedInteger SVar2;
  SQFuncState *this_00;
  uint uVar3;
  SQObjectValue SVar4;
  undefined1 uVar5;
  bool bVar6;
  SQObjectType SVar7;
  SQInteger SVar8;
  SQInteger SVar9;
  SQObjectValue SVar10;
  SQOpcode op;
  ulong value;
  SQObject *i;
  char *s;
  SQFuncState *pSVar11;
  long lVar12;
  SQObject SVar13;
  SQObjectPtr constval;
  SQObject constant;
  SQObject local_70;
  SQObject local_60;
  SQObjectPtr local_50;
  SQObject local_40;
  
  lVar12 = this->_token;
  if (lVar12 < 0x116) {
    if (0x7a < lVar12) {
      switch(lVar12) {
      case 0x102:
        goto switchD_0011d77a_caseD_102;
      case 0x103:
        pSVar11 = this->_fs;
        SVar8 = SQFuncState::PushTarget(pSVar11,-1);
        uVar5 = (undefined1)SVar8;
        this_00 = this->_fs;
        SVar13 = SQFuncState::CreateString
                           (this_00,(this->_lex)._svalue,(this->_lex)._longstr._size - 1);
        local_70._unVal = SVar13._unVal;
        local_70._type = SVar13._type;
        SVar8 = SQFuncState::GetConstant(this_00,&local_70);
        SVar7 = (SQObjectType)SVar8;
        i = &local_40;
        goto LAB_0011db45;
      case 0x104:
        SVar8 = (this->_lex)._nvalue;
        goto LAB_0011dad6;
      case 0x105:
        EmitLoadConstFloat(this,(this->_lex)._fvalue,-1);
        goto LAB_0011dc6c;
      case 0x106:
        SVar8 = SQLexer::Lex(&this->_lex);
        this->_token = SVar8;
        pSVar11 = this->_fs;
        SVar8 = SQFuncState::PushTarget(pSVar11,-1);
        local_70._4_1_ = 0x3b;
        local_70._5_1_ = SUB81(SVar8,0);
        local_70._type = 0;
        local_70._6_2_ = 0;
        SQFuncState::AddInstruction(pSVar11,(SQInstruction *)&local_70);
        (this->_es).etype = 3;
        SVar8 = SQFuncState::TopTarget(this->_fs);
        (this->_es).epos = SVar8;
        return SVar8;
      case 0x107:
        DeleteExpr(this);
        goto LAB_0011dc8d;
      default:
        if (lVar12 == 0x7b) {
          pSVar11 = this->_fs;
          SVar8 = SQFuncState::PushTarget(pSVar11,-1);
          local_70._4_1_ = 0x21;
          local_70._5_1_ = SUB81(SVar8,0);
          local_70._type = 0;
          local_70._6_2_ = 0;
          SQFuncState::AddInstruction(pSVar11,(SQInstruction *)&local_70);
          SVar8 = SQLexer::Lex(&this->_lex);
          this->_token = SVar8;
          ParseTableOrClass(this,0x2c,0x7d);
          goto LAB_0011dc8d;
        }
        if (lVar12 != 0x7e) goto switchD_0011d74c_caseD_11e;
        SVar8 = SQLexer::Lex(&this->_lex);
        this->_token = SVar8;
        if (SVar8 == 0x104) {
          value = ~(this->_lex)._nvalue;
          goto LAB_0011d8b3;
        }
        op = _OP_BWNOT;
      }
      goto LAB_0011dc88;
    }
    if (lVar12 < 0x2d) {
      if (lVar12 != 0x21) {
        if (lVar12 == 0x28) {
          SVar8 = SQLexer::Lex(&this->_lex);
          this->_token = SVar8;
          CommaExpr(this);
          Expect(this,0x29);
          goto LAB_0011dc8d;
        }
        goto switchD_0011d74c_caseD_11e;
      }
      SVar8 = SQLexer::Lex(&this->_lex);
      this->_token = SVar8;
      op = _OP_NOT;
      goto LAB_0011dc88;
    }
    if (lVar12 == 0x2d) {
      SVar8 = SQLexer::Lex(&this->_lex);
      this->_token = SVar8;
      if (SVar8 == 0x105) {
        EmitLoadConstFloat(this,-(this->_lex)._fvalue,-1);
      }
      else {
        if (SVar8 != 0x104) {
          op = _OP_NEG;
          goto LAB_0011dc88;
        }
        value = -(this->_lex)._nvalue;
LAB_0011d8b3:
        EmitLoadConstInt(this,value,-1);
      }
    }
    else {
      if (lVar12 == 0x40) {
        SVar8 = 0x40;
        bVar6 = true;
        goto LAB_0011d9e3;
      }
      if (lVar12 != 0x5b) goto switchD_0011d74c_caseD_11e;
      pSVar11 = this->_fs;
      SVar8 = SQFuncState::PushTarget(pSVar11,-1);
      local_70._4_1_ = 0x21;
      local_70._5_1_ = SUB81(SVar8,0);
      local_70._type = 0;
      local_70._6_2_ = 0x100;
      SQFuncState::AddInstruction(pSVar11,(SQInstruction *)&local_70);
      SVar2 = (this->_fs->_instructions)._size;
      SVar8 = SQLexer::Lex(&this->_lex);
      this->_token = SVar8;
      lVar12 = 0;
      if (SVar8 != 0x5d) {
        do {
          Expression(this);
          if (this->_token == 0x2c) {
            SVar8 = SQLexer::Lex(&this->_lex);
            this->_token = SVar8;
          }
          SVar8 = SQFuncState::PopTarget(this->_fs);
          SVar9 = SQFuncState::TopTarget(this->_fs);
          local_70._4_1_ = 0x22;
          local_70._5_1_ = SUB81(SVar9,0);
          local_70._type = (SQObjectType)SVar8;
          local_70._6_2_ = 0;
          SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_70);
          lVar12 = lVar12 + 1;
        } while (this->_token != 0x5d);
      }
      SQFuncState::SetIntructionParam(this->_fs,SVar2 - 1,1,lVar12);
    }
    goto LAB_0011dc6c;
  }
  switch(lVar12) {
  case 0x11c:
    SVar8 = SQLexer::Lex(&this->_lex);
    this->_token = SVar8;
    op = _OP_CLONE;
    goto LAB_0011dc88;
  case 0x11d:
    SVar8 = 0x11d;
    bVar6 = false;
LAB_0011d9e3:
    FunctionExp(this,SVar8,bVar6);
    break;
  case 0x11e:
  case 0x120:
  case 0x121:
  case 0x122:
  case 0x123:
  case 0x124:
  case 0x125:
  case 0x126:
  case 0x127:
  case 0x128:
  case 0x129:
  case 300:
  case 0x12d:
  case 0x131:
  case 0x132:
  case 0x134:
  case 0x135:
  case 0x137:
  case 0x138:
    goto switchD_0011d74c_caseD_11e;
  case 0x11f:
    SVar8 = SQLexer::Lex(&this->_lex);
    this->_token = SVar8;
    op = _OP_TYPEOF;
    goto LAB_0011dc88;
  case 0x12a:
    SVar8 = SQLexer::Lex(&this->_lex);
    this->_token = SVar8;
    op = _OP_RESUME;
LAB_0011dc88:
    UnaryOP(this,op);
    break;
  case 299:
    pSVar11 = this->_fs;
    SVar8 = SQFuncState::PushTarget(pSVar11,-1);
    local_70._4_1_ = 0x19;
    local_70._5_1_ = SUB81(SVar8,0);
    local_70._type = 0;
    local_70._6_2_ = 0;
    SQFuncState::AddInstruction(pSVar11,(SQInstruction *)&local_70);
    (this->_es).etype = 2;
    this->_token = 0x2e;
    (this->_es).epos = -1;
    return -1;
  case 0x12e:
  case 0x136:
switchD_0011d77a_caseD_102:
    if (lVar12 == 0x136) {
      pSVar11 = this->_fs;
      s = "constructor";
      SVar8 = 0xb;
LAB_0011db95:
      SVar13 = SQFuncState::CreateString(pSVar11,s,SVar8);
      local_70._unVal = SVar13._unVal;
      local_70._type = SVar13._type;
    }
    else {
      if (lVar12 == 0x12e) {
        pSVar11 = this->_fs;
        s = "this";
        SVar8 = 4;
        goto LAB_0011db95;
      }
      if (lVar12 == 0x102) {
        pSVar11 = this->_fs;
        s = (this->_lex)._svalue;
        SVar8 = -1;
        goto LAB_0011db95;
      }
    }
    SVar8 = SQLexer::Lex(&this->_lex);
    this->_token = SVar8;
    SVar8 = SQFuncState::GetLocalVariable(this->_fs,&local_70);
    if (SVar8 == -1) {
      SVar8 = SQFuncState::GetOuterVariable(this->_fs,&local_70);
      if (SVar8 == -1) {
        bVar6 = SQFuncState::IsConstant(this->_fs,&local_70,&local_40);
        if (bVar6) {
          local_60._type = OT_NULL;
          local_60._unVal.pTable = (SQTable *)0x0;
          if (local_40._type == OT_TABLE) {
            Expect(this,0x2e);
            SVar13 = Expect(this,0x102);
            SVar10 = SVar13._unVal;
            local_50.super_SQObject._type = SVar13._type;
            if ((local_50.super_SQObject._type >> 0x1b & 1) != 0) {
              pSVar1 = &((SVar10.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                        _uiRef;
              *pSVar1 = *pSVar1 + 1;
            }
            local_50.super_SQObject._unVal.nInteger = SVar10.nInteger;
            bVar6 = SQTable::Get(local_40._unVal.pTable,&local_50,(SQObjectPtr *)&local_60);
            SQObjectPtr::~SQObjectPtr(&local_50);
            SVar4 = local_60._unVal;
            if (!bVar6) {
              uVar3 = local_60._type >> 0x1b;
              local_60._type = OT_NULL;
              local_60._unVal.pTable = (SQTable *)0x0;
              if ((uVar3 & 1) != 0) {
                pSVar1 = &((SVar4.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted
                          ._uiRef;
                *pSVar1 = *pSVar1 - 1;
                if (*pSVar1 == 0) {
                  (*((SVar4.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                    _vptr_SQRefCounted[2])();
                }
              }
              Error(this,"invalid constant [%s.%s]",&(local_70._unVal.pTable)->_firstfree,
                    &(SVar10.pTable)->_firstfree);
            }
          }
          else {
            SQObjectPtr::operator=((SQObjectPtr *)&local_60,&local_40);
          }
          SVar8 = SQFuncState::PushTarget(this->_fs,-1);
          (this->_es).epos = SVar8;
          if (local_60._type == OT_BOOL) {
            local_50.super_SQObject._4_1_ = '\x1a';
            local_50.super_SQObject._type = (SQObjectType)local_60._unVal.fFloat;
            local_50.super_SQObject._6_2_ = 0;
            local_50.super_SQObject._5_1_ = (uchar)SVar8;
            SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_50);
          }
          else if (local_60._type == OT_FLOAT) {
            EmitLoadConstFloat(this,local_60._unVal.fFloat,SVar8);
          }
          else if (local_60._type == OT_INTEGER) {
            EmitLoadConstInt(this,local_60._unVal.nInteger,SVar8);
          }
          else {
            pSVar11 = this->_fs;
            SVar9 = SQFuncState::GetConstant(pSVar11,&local_60);
            local_50.super_SQObject._4_1_ = '\x01';
            local_50.super_SQObject._type = (SQObjectType)SVar9;
            local_50.super_SQObject._6_2_ = 0;
            local_50.super_SQObject._5_1_ = (uchar)SVar8;
            SQFuncState::AddInstruction(pSVar11,(SQInstruction *)&local_50);
          }
          (this->_es).etype = 1;
          SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_60);
        }
        else {
          SQFuncState::PushTarget(this->_fs,0);
          pSVar11 = this->_fs;
          SVar8 = SQFuncState::PushTarget(pSVar11,-1);
          SVar9 = SQFuncState::GetConstant(this->_fs,&local_70);
          local_60._4_1_ = 1;
          local_60._5_1_ = SUB81(SVar8,0);
          local_60._type = (SQObjectType)SVar9;
          local_60._6_2_ = 0;
          SQFuncState::AddInstruction(pSVar11,(SQInstruction *)&local_60);
          bVar6 = NeedGet(this);
          if (bVar6) {
            Emit2ArgsOP(this,_OP_GET,0);
          }
          (this->_es).etype = 2;
        }
        goto LAB_0011dbe4;
      }
      bVar6 = NeedGet(this);
      if (bVar6) {
        SVar9 = SQFuncState::PushTarget(this->_fs,-1);
        (this->_es).epos = SVar9;
        local_60._4_1_ = 0x20;
        local_60._5_1_ = SUB81(SVar9,0);
        local_60._type = (SQObjectType)SVar8;
        local_60._6_2_ = 0;
        SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_60);
        goto LAB_0011dbe4;
      }
      (this->_es).etype = 5;
    }
    else {
      SQFuncState::PushTarget(this->_fs,SVar8);
      (this->_es).etype = 4;
    }
    (this->_es).epos = SVar8;
LAB_0011dbe4:
    return (this->_es).epos;
  case 0x12f:
  case 0x130:
    PrefixIncDec(this,lVar12);
    break;
  case 0x133:
    SVar8 = SQLexer::Lex(&this->_lex);
    this->_token = SVar8;
    ClassExp(this);
    break;
  case 0x139:
    SVar8 = (this->_lex)._currentline;
LAB_0011dad6:
    EmitLoadConstInt(this,SVar8,-1);
    goto LAB_0011dc6c;
  case 0x13a:
    pSVar11 = this->_fs;
    SVar8 = SQFuncState::PushTarget(pSVar11,-1);
    uVar5 = (undefined1)SVar8;
    SVar8 = SQFuncState::GetConstant(this->_fs,&(this->_sourcename).super_SQObject);
    SVar7 = (SQObjectType)SVar8;
    i = &local_70;
LAB_0011db45:
    i->field_0x4 = 1;
    i->field_0x5 = uVar5;
    i->_type = SVar7;
    goto LAB_0011db4f;
  case 0x13b:
  case 0x13c:
    pSVar11 = this->_fs;
    SVar8 = SQFuncState::PushTarget(pSVar11,-1);
    i = &local_70;
    local_70._4_1_ = 0x1a;
    local_70._5_1_ = SUB81(SVar8,0);
    local_70._type = (SQObjectType)(this->_token == 0x13b);
LAB_0011db4f:
    *(undefined2 *)&i->field_0x6 = 0;
    SQFuncState::AddInstruction(pSVar11,(SQInstruction *)i);
LAB_0011dc6c:
    SVar8 = SQLexer::Lex(&this->_lex);
    this->_token = SVar8;
    break;
  default:
    if (lVar12 == 0x116) {
      pSVar11 = this->_fs;
      SVar8 = SQFuncState::PushTarget(pSVar11,-1);
      i = &local_70;
      local_70._4_1_ = 0x18;
      local_70._5_1_ = SUB81(SVar8,0);
      local_70._type = 1;
      goto LAB_0011db4f;
    }
    goto switchD_0011d74c_caseD_11e;
  }
LAB_0011dc8d:
  (this->_es).etype = 1;
  return -1;
switchD_0011d74c_caseD_11e:
  Error(this,"expression expected");
  goto LAB_0011dc8d;
}

Assistant:

SQInteger Factor()
    {
        //_es.etype = EXPR;
        switch(_token)
        {
        case TK_STRING_LITERAL:
            _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(_fs->CreateString(_lex._svalue,_lex._longstr.size()-1)));
            Lex();
            break;
        case TK_BASE:
            Lex();
            _fs->AddInstruction(_OP_GETBASE, _fs->PushTarget());
            _es.etype  = BASE;
            _es.epos   = _fs->TopTarget();
            return (_es.epos);
            break;
        case TK_IDENTIFIER:
        case TK_CONSTRUCTOR:
        case TK_THIS:{
                SQObject id;
                SQObject constant;

                switch(_token) {
                    case TK_IDENTIFIER:  id = _fs->CreateString(_lex._svalue);       break;
                    case TK_THIS:        id = _fs->CreateString(_SC("this"),4);        break;
                    case TK_CONSTRUCTOR: id = _fs->CreateString(_SC("constructor"),11); break;
                }

                SQInteger pos = -1;
                Lex();
                if((pos = _fs->GetLocalVariable(id)) != -1) {
                    /* Handle a local variable (includes 'this') */
                    _fs->PushTarget(pos);
                    _es.etype  = LOCAL;
                    _es.epos   = pos;
                }

                else if((pos = _fs->GetOuterVariable(id)) != -1) {
                    /* Handle a free var */
                    if(NeedGet()) {
                        _es.epos  = _fs->PushTarget();
                        _fs->AddInstruction(_OP_GETOUTER, _es.epos, pos);
                        /* _es.etype = EXPR; already default value */
                    }
                    else {
                        _es.etype = OUTER;
                        _es.epos  = pos;
                    }
                }

                else if(_fs->IsConstant(id, constant)) {
                    /* Handle named constant */
                    SQObjectPtr constval;
                    SQObject    constid;
                    if(type(constant) == OT_TABLE) {
                        Expect('.');
                        constid = Expect(TK_IDENTIFIER);
                        if(!_table(constant)->Get(constid, constval)) {
                            constval.Null();
                            Error(_SC("invalid constant [%s.%s]"), _stringval(id), _stringval(constid));
                        }
                    }
                    else {
                        constval = constant;
                    }
                    _es.epos = _fs->PushTarget();

                    /* generate direct or literal function depending on size */
                    SQObjectType ctype = type(constval);
                    switch(ctype) {
                        case OT_INTEGER: EmitLoadConstInt(_integer(constval),_es.epos); break;
                        case OT_FLOAT: EmitLoadConstFloat(_float(constval),_es.epos); break;
                        case OT_BOOL: _fs->AddInstruction(_OP_LOADBOOL, _es.epos, _integer(constval)); break;
                        default: _fs->AddInstruction(_OP_LOAD,_es.epos,_fs->GetConstant(constval)); break;
                    }
                    _es.etype = EXPR;
                }
                else {
                    /* Handle a non-local variable, aka a field. Push the 'this' pointer on
                    * the virtual stack (always found in offset 0, so no instruction needs to
                    * be generated), and push the key next. Generate an _OP_LOAD instruction
                    * for the latter. If we are not using the variable as a dref expr, generate
                    * the _OP_GET instruction.
                    */
                    _fs->PushTarget(0);
                    _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(id));
                    if(NeedGet()) {
                        Emit2ArgsOP(_OP_GET);
                    }
                    _es.etype = OBJECT;
                }
                return _es.epos;
            }
            break;
        case TK_DOUBLE_COLON:  // "::"
            _fs->AddInstruction(_OP_LOADROOT, _fs->PushTarget());
            _es.etype = OBJECT;
            _token = _SC('.'); /* hack: drop into PrefixExpr, case '.'*/
            _es.epos = -1;
            return _es.epos;
            break;
        case TK_NULL:
            _fs->AddInstruction(_OP_LOADNULLS, _fs->PushTarget(),1);
            Lex();
            break;
        case TK_INTEGER: EmitLoadConstInt(_lex._nvalue,-1); Lex();  break;
        case TK_FLOAT: EmitLoadConstFloat(_lex._fvalue,-1); Lex(); break;
        case TK_TRUE: case TK_FALSE:
            _fs->AddInstruction(_OP_LOADBOOL, _fs->PushTarget(),_token == TK_TRUE?1:0);
            Lex();
            break;
        case _SC('['): {
                _fs->AddInstruction(_OP_NEWOBJ, _fs->PushTarget(),0,0,NOT_ARRAY);
                SQInteger apos = _fs->GetCurrentPos(),key = 0;
                Lex();
                while(_token != _SC(']')) {
                    Expression();
                    if(_token == _SC(',')) Lex();
                    SQInteger val = _fs->PopTarget();
                    SQInteger array = _fs->TopTarget();
                    _fs->AddInstruction(_OP_APPENDARRAY, array, val, AAT_STACK);
                    key++;
                }
                _fs->SetIntructionParam(apos, 1, key);
                Lex();
            }
            break;
        case _SC('{'):
            _fs->AddInstruction(_OP_NEWOBJ, _fs->PushTarget(),0,NOT_TABLE);
            Lex();ParseTableOrClass(_SC(','),_SC('}'));
            break;
        case TK_FUNCTION: FunctionExp(_token);break;
        case _SC('@'): FunctionExp(_token,true);break;
        case TK_CLASS: Lex(); ClassExp();break;
        case _SC('-'):
            Lex();
            switch(_token) {
            case TK_INTEGER: EmitLoadConstInt(-_lex._nvalue,-1); Lex(); break;
            case TK_FLOAT: EmitLoadConstFloat(-_lex._fvalue,-1); Lex(); break;
            default: UnaryOP(_OP_NEG);
            }
            break;
        case _SC('!'): Lex(); UnaryOP(_OP_NOT); break;
        case _SC('~'):
            Lex();
            if(_token == TK_INTEGER)  { EmitLoadConstInt(~_lex._nvalue,-1); Lex(); break; }
            UnaryOP(_OP_BWNOT);
            break;
        case TK_TYPEOF : Lex() ;UnaryOP(_OP_TYPEOF); break;
        case TK_RESUME : Lex(); UnaryOP(_OP_RESUME); break;
        case TK_CLONE : Lex(); UnaryOP(_OP_CLONE); break;
        case TK_MINUSMINUS :
        case TK_PLUSPLUS :PrefixIncDec(_token); break;
        case TK_DELETE : DeleteExpr(); break;
        case _SC('('): Lex(); CommaExpr(); Expect(_SC(')'));
            break;
        case TK___LINE__: EmitLoadConstInt(_lex._currentline,-1); Lex(); break;
        case TK___FILE__: _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(_sourcename)); Lex(); break;
        default: Error(_SC("expression expected"));
        }
        _es.etype = EXPR;
        return -1;
    }